

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinExport::WriteBinaryCamera(AssbinExport *this,IOStream *container,aiCamera *cam)

{
  undefined1 local_58 [8];
  AssbinChunkWriter chunk;
  aiCamera *cam_local;
  IOStream *container_local;
  AssbinExport *this_local;
  
  chunk.initial = (size_t)cam;
  AssbinChunkWriter::AssbinChunkWriter((AssbinChunkWriter *)local_58,container,0x1234,0x1000);
  Write<aiString>((IOStream *)local_58,(aiString *)chunk.initial);
  Write<aiVector3t<float>>((IOStream *)local_58,(aiVector3D *)(chunk.initial + 0x404));
  Write<aiVector3t<float>>((IOStream *)local_58,(aiVector3D *)(chunk.initial + 0x41c));
  Write<aiVector3t<float>>((IOStream *)local_58,(aiVector3D *)(chunk.initial + 0x410));
  Write<float>((IOStream *)local_58,(float *)(chunk.initial + 0x428));
  Write<float>((IOStream *)local_58,(float *)(chunk.initial + 0x42c));
  Write<float>((IOStream *)local_58,(float *)(chunk.initial + 0x430));
  Write<float>((IOStream *)local_58,(float *)(chunk.initial + 0x434));
  AssbinChunkWriter::~AssbinChunkWriter((AssbinChunkWriter *)local_58);
  return;
}

Assistant:

void WriteBinaryCamera( IOStream * container, const aiCamera* cam )
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AICAMERA );

        Write<aiString>(&chunk,cam->mName);
        Write<aiVector3D>(&chunk,cam->mPosition);
        Write<aiVector3D>(&chunk,cam->mLookAt);
        Write<aiVector3D>(&chunk,cam->mUp);
        Write<float>(&chunk,cam->mHorizontalFOV);
        Write<float>(&chunk,cam->mClipPlaneNear);
        Write<float>(&chunk,cam->mClipPlaneFar);
        Write<float>(&chunk,cam->mAspect);
    }